

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

error_code ghc::filesystem::detail::make_error_code(portable_error err)

{
  error_code *this;
  error_category *peVar1;
  uint in_EDI;
  error_code eVar2;
  error_code local_10;
  
  this = (error_code *)(ulong)in_EDI;
  switch(this) {
  case (error_code *)0x0:
    std::error_code::error_code(this);
    break;
  case (error_code *)0x1:
    peVar1 = (error_category *)std::_V2::system_category();
    std::error_code::error_code(&local_10,0x11,peVar1);
    break;
  case (error_code *)0x2:
    peVar1 = (error_category *)std::_V2::system_category();
    std::error_code::error_code(&local_10,2,peVar1);
    break;
  case (error_code *)0x3:
    peVar1 = (error_category *)std::_V2::system_category();
    std::error_code::error_code(&local_10,0x5f,peVar1);
    break;
  case (error_code *)0x4:
    peVar1 = (error_category *)std::_V2::system_category();
    std::error_code::error_code(&local_10,0x26,peVar1);
    break;
  case (error_code *)0x5:
    peVar1 = (error_category *)std::_V2::system_category();
    std::error_code::error_code(&local_10,0x16,peVar1);
    break;
  case (error_code *)0x6:
    peVar1 = (error_category *)std::_V2::system_category();
    std::error_code::error_code(&local_10,0x15,peVar1);
    break;
  default:
    std::error_code::error_code(this);
  }
  eVar2._4_4_ = 0;
  eVar2._M_value = local_10._M_value;
  eVar2._M_cat = local_10._M_cat;
  return eVar2;
}

Assistant:

GHC_INLINE std::error_code make_error_code(portable_error err)
{
#ifdef GHC_OS_WINDOWS
    switch (err) {
        case portable_error::none:
            return std::error_code();
        case portable_error::exists:
            return std::error_code(ERROR_ALREADY_EXISTS, std::system_category());
        case portable_error::not_found:
            return std::error_code(ERROR_PATH_NOT_FOUND, std::system_category());
        case portable_error::not_supported:
            return std::error_code(ERROR_NOT_SUPPORTED, std::system_category());
        case portable_error::not_implemented:
            return std::error_code(ERROR_CALL_NOT_IMPLEMENTED, std::system_category());
        case portable_error::invalid_argument:
            return std::error_code(ERROR_INVALID_PARAMETER, std::system_category());
        case portable_error::is_a_directory:
#ifdef ERROR_DIRECTORY_NOT_SUPPORTED
            return std::error_code(ERROR_DIRECTORY_NOT_SUPPORTED, std::system_category());
#else
            return std::error_code(ERROR_NOT_SUPPORTED, std::system_category());
#endif
    }
#else
    switch (err) {
        case portable_error::none:
            return std::error_code();
        case portable_error::exists:
            return std::error_code(EEXIST, std::system_category());
        case portable_error::not_found:
            return std::error_code(ENOENT, std::system_category());
        case portable_error::not_supported:
            return std::error_code(ENOTSUP, std::system_category());
        case portable_error::not_implemented:
            return std::error_code(ENOSYS, std::system_category());
        case portable_error::invalid_argument:
            return std::error_code(EINVAL, std::system_category());
        case portable_error::is_a_directory:
            return std::error_code(EISDIR, std::system_category());
    }
#endif
    return std::error_code();
}